

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O1

void __thiscall DLoadSaveMenu::Drawer(DLoadSaveMenu *this)

{
  FBrokenLines *pFVar1;
  undefined8 uVar2;
  BYTE *pBVar3;
  int iVar4;
  int iVar5;
  char *name;
  FFont *font;
  DFrameBuffer *this_00;
  int iVar6;
  FSaveGameNode *string;
  ulong uVar7;
  long lVar8;
  int iVar9;
  char curs [2];
  
  DListMenu::Drawer(&this->super_DListMenu);
  if ((ga_savegame < gameaction) ||
     ((0x260U >> (gameaction & (ga_togglemap|ga_screenshot)) & 1) == 0)) {
    V_DrawFrame(this->savepicLeft,this->savepicTop,this->savepicWidth,this->savepicHeight);
    if (this->SavePic == (FTexture *)0x0) {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])();
      if (SaveGames.Count != 0) {
        if ((long)this->Selected == -1) {
          name = "MNU_NOPICTURE";
        }
        else {
          name = "MNU_NOPICTURE";
          if (SaveGames.Array[this->Selected]->bOldVersion != false) {
            name = "MNU_DIFFVERSION";
          }
        }
        pBVar3 = (BYTE *)FStringTable::operator()(&GStrings,name);
        iVar9 = FFont::StringWidth(SmallFont,pBVar3);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,5,
                          (this->savepicWidth - iVar9 * CleanXfac) / 2 + this->savepicLeft,
                          (this->savepicHeight - this->rowHeight) / 2 + this->savepicTop,
                          (char *)pBVar3,0x40001393,1,0);
      }
    }
    else {
      DCanvas::DrawTexture
                ((DCanvas *)screen,this->SavePic,(double)this->savepicLeft,(double)this->savepicTop,
                 0x40001389,(ulong)(uint)this->savepicWidth,0x4000138a,
                 (ulong)(uint)this->savepicHeight,0x400013a5,0,0);
    }
    V_DrawFrame(this->commentLeft,this->commentTop,this->commentWidth,this->commentHeight);
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (screen,(ulong)(uint)this->commentLeft,(ulong)(uint)this->commentTop,
               (ulong)(uint)this->commentRight,(ulong)(uint)this->commentBottom,0,0);
    pFVar1 = this->SaveComment;
    if (pFVar1 != (FBrokenLines *)0x0) {
      lVar8 = 8;
      uVar7 = 0;
      do {
        if ((*(int *)((long)pFVar1 + lVar8 + -8) < 0) || (5 < uVar7)) break;
        DCanvas::DrawText((DCanvas *)screen,SmallFont,5,this->commentLeft,
                          SmallFont->FontHeight * (int)uVar7 * CleanYfac + this->commentTop,
                          *(char **)((long)&pFVar1->Width + lVar8),0x40001393,1,0);
        uVar7 = uVar7 + 1;
        pFVar1 = this->SaveComment;
        lVar8 = lVar8 + 0x10;
      } while (pFVar1 != (FBrokenLines *)0x0);
    }
    V_DrawFrame(this->listboxLeft,this->listboxTop,this->listboxWidth,this->listboxHeight);
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (screen,(ulong)(uint)this->listboxLeft,(ulong)(uint)this->listboxTop,
               (ulong)(uint)this->listboxRight,(ulong)(uint)this->listboxBottom,0,0);
    if (SaveGames.Count == 0) {
      pBVar3 = (BYTE *)FStringTable::operator()(&GStrings,"MNU_NOFILES");
      iVar9 = FFont::StringWidth(SmallFont,pBVar3);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,5,
                        (this->listboxWidth - iVar9 * CleanXfac) / 2 + this->listboxLeft,
                        (this->listboxHeight - this->rowHeight) / 2 + this->listboxTop,
                        (char *)pBVar3,0x40001393,1,0);
    }
    else if ((0 < this->listboxRows) &&
            (uVar7 = (ulong)(uint)this->TopItem, (uint)this->TopItem < SaveGames.Count)) {
      iVar9 = 0;
      do {
        string = SaveGames.Array[uVar7];
        iVar5 = 7;
        if ((string->bOldVersion == false) && (iVar5 = 8, string->bMissingWads == false)) {
          iVar5 = (uint)(uVar7 == (uint)this->Selected) * 8 + 1;
        }
        if (uVar7 == (uint)this->Selected) {
          uVar2 = 0xff0000ff;
          if (this->mEntering != false) {
            uVar2 = 0xffff0000;
          }
          (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                    (screen,(ulong)(uint)this->listboxLeft,
                     (ulong)(uint)(this->rowHeight * iVar9 + this->listboxTop),
                     (ulong)(uint)this->listboxRight,
                     (ulong)(uint)((iVar9 + 1) * this->rowHeight + this->listboxTop),0xffffffff,
                     uVar2);
          iVar4 = this->listboxLeft + 1;
          iVar6 = this->rowHeight * iVar9 + this->listboxTop + CleanYfac;
          if (this->mEntering != false) {
            DCanvas::DrawText((DCanvas *)screen,SmallFont,9,iVar4,iVar6,this->savegamestring,
                              0x40001393,1,0);
            this_00 = screen;
            font = SmallFont;
            curs[0] = SmallFont->Cursor;
            curs[1] = '\0';
            iVar4 = this->listboxLeft;
            iVar5 = FFont::StringWidth(SmallFont,(BYTE *)this->savegamestring);
            iVar4 = iVar5 * CleanXfac + iVar4;
            iVar6 = this->rowHeight * iVar9 + this->listboxTop + CleanYfac;
            iVar5 = 9;
            string = (FSaveGameNode *)curs;
            goto LAB_0033272d;
          }
          DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar5,iVar4,iVar6,string->Title,0x40001393,1
                            ,0);
        }
        else {
          iVar4 = this->listboxLeft;
          iVar6 = this->rowHeight * iVar9 + this->listboxTop + CleanYfac;
          font = SmallFont;
          this_00 = screen;
LAB_0033272d:
          DCanvas::DrawText((DCanvas *)this_00,font,iVar5,iVar4 + 1,iVar6,string->Title,0x40001393,1
                            ,0);
        }
        iVar9 = iVar9 + 1;
      } while ((iVar9 < this->listboxRows) && (uVar7 = uVar7 + 1, uVar7 < SaveGames.Count));
    }
  }
  return;
}

Assistant:

void DLoadSaveMenu::Drawer ()
{
	Super::Drawer();

	FSaveGameNode *node;
	int i;
	unsigned j;
	bool didSeeSelected = false;

	// Draw picture area
	if (gameaction == ga_loadgame || gameaction == ga_loadgamehidecon || gameaction == ga_savegame)
	{
		return;
	}

	V_DrawFrame (savepicLeft, savepicTop, savepicWidth, savepicHeight);
	if (SavePic != NULL)
	{
		screen->DrawTexture(SavePic, savepicLeft, savepicTop,
			DTA_DestWidth, savepicWidth,
			DTA_DestHeight, savepicHeight,
			DTA_Masked, false,
			TAG_DONE);
	}
	else
	{
		screen->Clear (savepicLeft, savepicTop,
			savepicLeft+savepicWidth, savepicTop+savepicHeight, 0, 0);

		if (SaveGames.Size() > 0)
		{
			const char *text =
				(Selected == -1 || !SaveGames[Selected]->bOldVersion)
				? GStrings("MNU_NOPICTURE") : GStrings("MNU_DIFFVERSION");
			const int textlen = SmallFont->StringWidth (text)*CleanXfac;

			screen->DrawText (SmallFont, CR_GOLD, savepicLeft+(savepicWidth-textlen)/2,
				savepicTop+(savepicHeight-rowHeight)/2, text,
				DTA_CleanNoMove, true, TAG_DONE);
		}
	}

	// Draw comment area
	V_DrawFrame (commentLeft, commentTop, commentWidth, commentHeight);
	screen->Clear (commentLeft, commentTop, commentRight, commentBottom, 0, 0);
	if (SaveComment != NULL)
	{
		// I'm not sure why SaveComment would go NULL in this loop, but I got
		// a crash report where it was NULL when i reached 1, so now I check
		// for that.
		for (i = 0; SaveComment != NULL && SaveComment[i].Width >= 0 && i < 6; ++i)
		{
			screen->DrawText (SmallFont, CR_GOLD, commentLeft, commentTop
				+ SmallFont->GetHeight()*i*CleanYfac, SaveComment[i].Text,
				DTA_CleanNoMove, true, TAG_DONE);
		}
	}

	// Draw file area
	V_DrawFrame (listboxLeft, listboxTop, listboxWidth, listboxHeight);
	screen->Clear (listboxLeft, listboxTop, listboxRight, listboxBottom, 0, 0);

	if (SaveGames.Size() == 0)
	{
		const char * text = GStrings("MNU_NOFILES");
		const int textlen = SmallFont->StringWidth (text)*CleanXfac;

		screen->DrawText (SmallFont, CR_GOLD, listboxLeft+(listboxWidth-textlen)/2,
			listboxTop+(listboxHeight-rowHeight)/2, text,
			DTA_CleanNoMove, true, TAG_DONE);
		return;
	}

	for (i = 0, j = TopItem; i < listboxRows && j < SaveGames.Size(); i++,j++)
	{
		int color;
		node = SaveGames[j];
		if (node->bOldVersion)
		{
			color = CR_BLUE;
		}
		else if (node->bMissingWads)
		{
			color = CR_ORANGE;
		}
		else if ((int)j == Selected)
		{
			color = CR_WHITE;
		}
		else
		{
			color = CR_TAN;
		}

		if ((int)j == Selected)
		{
			screen->Clear (listboxLeft, listboxTop+rowHeight*i,
				listboxRight, listboxTop+rowHeight*(i+1), -1,
				mEntering ? MAKEARGB(255,255,0,0) : MAKEARGB(255,0,0,255));
			didSeeSelected = true;
			if (!mEntering)
			{
				screen->DrawText (SmallFont, color,
					listboxLeft+1, listboxTop+rowHeight*i+CleanYfac, node->Title,
					DTA_CleanNoMove, true, TAG_DONE);
			}
			else
			{
				screen->DrawText (SmallFont, CR_WHITE,
					listboxLeft+1, listboxTop+rowHeight*i+CleanYfac, savegamestring,
					DTA_CleanNoMove, true, TAG_DONE);

				char curs[2] = { SmallFont->GetCursor(), 0 };
				screen->DrawText (SmallFont, CR_WHITE,
					listboxLeft+1+SmallFont->StringWidth (savegamestring)*CleanXfac,
					listboxTop+rowHeight*i+CleanYfac, 
					curs,
					DTA_CleanNoMove, true, TAG_DONE);
			}
		}
		else
		{
			screen->DrawText (SmallFont, color,
				listboxLeft+1, listboxTop+rowHeight*i+CleanYfac, node->Title,
				DTA_CleanNoMove, true, TAG_DONE);
		}
	}
}